

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

char_t * __thiscall
pugi::impl::anon_unknown_0::xpath_parser::alloc_string(xpath_parser *this,xpath_lexer_string *value)

{
  char *__dest;
  size_t __n;
  
  if (value->begin == (char_t *)0x0) {
    __dest = "";
  }
  else {
    __n = (long)value->end - (long)value->begin;
    __dest = (char *)xpath_allocator::allocate(this->_alloc,__n + 1);
    if (__dest == (char *)0x0) {
      __dest = (char *)0x0;
    }
    else {
      memcpy(__dest,value->begin,__n);
      __dest[__n] = '\0';
    }
  }
  return __dest;
}

Assistant:

const char_t* alloc_string(const xpath_lexer_string& value)
		{
			if (!value.begin)
				return PUGIXML_TEXT("");

			size_t length = static_cast<size_t>(value.end - value.begin);

			char_t* c = static_cast<char_t*>(_alloc->allocate((length + 1) * sizeof(char_t)));
			if (!c) return NULL;

			memcpy(c, value.begin, length * sizeof(char_t));
			c[length] = 0;

			return c;
		}